

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_window_get_content_region_size(nk_context *ctx)

{
  nk_panel *pnVar1;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x498c,"struct nk_vec2 nk_window_get_content_region_size(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if (ctx->current->layout != (nk_panel *)0x0) {
      if ((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) {
        ctx_local = (nk_context *)nk_vec2(0.0,0.0);
      }
      else {
        pnVar1 = ctx->current->layout;
        ctx_local = (nk_context *)nk_vec2((pnVar1->clip).w,(pnVar1->clip).h);
      }
      return (nk_vec2)ctx_local;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x498e,"struct nk_vec2 nk_window_get_content_region_size(struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x498d,"struct nk_vec2 nk_window_get_content_region_size(struct nk_context *)");
}

Assistant:

NK_API struct nk_vec2
nk_window_get_content_region_size(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current) return nk_vec2(0,0);
    return nk_vec2(ctx->current->layout->clip.w, ctx->current->layout->clip.h);
}